

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.cc
# Opt level: O2

void Search::cs_cost_push_back(bool isCB,polylabel *ld,uint32_t index,float value)

{
  undefined7 in_register_00000039;
  cb_class local_10;
  
  local_10.cost = value;
  local_10.action = index;
  if ((int)CONCAT71(in_register_00000039,isCB) == 0) {
    local_10.probability = 0.0;
    local_10.partial_prediction = 0.0;
    v_array<COST_SENSITIVE::wclass>::push_back
              ((v_array<COST_SENSITIVE::wclass> *)&ld->simple,(wclass *)&local_10);
  }
  else {
    local_10.probability = 0.0;
    local_10.partial_prediction = 0.0;
    v_array<CB::cb_class>::push_back((v_array<CB::cb_class> *)&ld->simple,&local_10);
  }
  return;
}

Assistant:

inline void cs_cost_push_back(bool isCB, polylabel& ld, uint32_t index, float value)
{
  if (isCB)
  {
    CB::cb_class cost = {value, index, 0., 0.};
    ld.cb.costs.push_back(cost);
  }
  else
  {
    CS::wclass cost = {value, index, 0., 0.};
    ld.cs.costs.push_back(cost);
  }
}